

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_23::Struct2Local::Struct2Local
          (Struct2Local *this,StructNew *allocation,EscapeAnalyzer *analyzer,Function *func,
          Module *wasm)

{
  pointer pFVar1;
  size_t sVar2;
  pointer pTVar3;
  pointer pTVar4;
  Index IVar5;
  Struct *pSVar6;
  TaskFunc p_Var7;
  Expression **ppEVar8;
  pointer pFVar9;
  ReFinalize local_1a8;
  Module *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .replacep = (Expression **)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .stack.usedFixed = 0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .currModule = (Module *)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .currFunction = (Function *)0x0;
  this->allocation = allocation;
  this->analyzer = analyzer;
  this->func = func;
  this->wasm = wasm;
  (this->builder).wasm = wasm;
  local_40 = wasm;
  local_1a8.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_Pass._vptr_Pass =
       (_func_int **)
       wasm::Type::getHeapType
                 (&(allocation->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression
                   .type);
  pSVar6 = HeapType::getStruct((HeapType *)&local_1a8);
  this->fields = &pSVar6->fields;
  local_38 = &this->localIndexes;
  (this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  pFVar1 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar9 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                _M_impl.super__Vector_impl_data._M_start; pFVar9 != pFVar1; pFVar9 = pFVar9 + 1) {
    IVar5 = Builder::addVar(func,(Type)(pFVar9->type).id);
    local_1a8.
    super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    .super_Pass._vptr_Pass =
         (_func_int **)
         CONCAT44(local_1a8.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .super_Pass._vptr_Pass._4_4_,IVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (local_38,(uint *)&local_1a8);
  }
  if (((long)(this->
             super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->
             super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) +
      (this->
      super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
      ).
      super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
      .stack.usedFixed == 0) {
    Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                *)this,PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                       ::scan,&func->body);
    while( true ) {
      sVar2 = (this->
              super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              ).
              super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              .stack.usedFixed;
      pTVar3 = (this->
               super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
               ).
               super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (this->
               super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
               ).
               super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((long)pTVar4 - (long)pTVar3 >> 4) + sVar2 == 0) {
        if (this->refinalize == true) {
          ReFinalize::ReFinalize(&local_1a8);
          Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
          walkFunctionInModule
                    (&local_1a8.
                      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                      .
                      super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                      .
                      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                     ,func,local_40);
          ReFinalize::~ReFinalize(&local_1a8);
        }
        return;
      }
      if (pTVar3 == pTVar4) {
        if (sVar2 == 0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Struct2Local, wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Struct2Local, wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>>::Task, N = 10]"
                       );
        }
        p_Var7 = (this->
                 super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                 ).
                 super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                 .stack.fixed._M_elems[sVar2 - 1].func;
        ppEVar8 = (this->
                  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                  ).
                  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                  .stack.fixed._M_elems[sVar2 - 1].currp;
        (this->
        super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
        ).
        super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
        .stack.usedFixed = sVar2 - 1;
      }
      else {
        p_Var7 = pTVar4[-1].func;
        ppEVar8 = pTVar4[-1].currp;
        (this->
        super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
        ).
        super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar4 + -1;
      }
      (this->
      super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
      ).
      super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
      .replacep = ppEVar8;
      if (*ppEVar8 == (Expression *)0x0) break;
      (*p_Var7)(this,ppEVar8);
    }
    __assert_fail("*task.currp",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x132,
                  "void wasm::Walker<wasm::(anonymous namespace)::Struct2Local, wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Struct2Local, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>]"
                 );
  }
  __assert_fail("stack.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x12d,
                "void wasm::Walker<wasm::(anonymous namespace)::Struct2Local, wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Struct2Local, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>]"
               );
}

Assistant:

Struct2Local(StructNew* allocation,
               EscapeAnalyzer& analyzer,
               Function* func,
               Module& wasm)
    : allocation(allocation), analyzer(analyzer), func(func), wasm(wasm),
      builder(wasm), fields(allocation->type.getHeapType().getStruct().fields) {

    // Allocate locals to store the allocation's fields in.
    for (auto field : fields) {
      localIndexes.push_back(builder.addVar(func, field.type));
    }

    // Replace the things we need to using the visit* methods.
    walk(func->body);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, &wasm);
    }
  }